

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * Fossilize::pnext_chain_pdf2_skip_ignored_entries(void *pNext)

{
  int iVar1;
  
  for (; ((((((int *)pNext != (int *)0x0 && (iVar1 = *pNext, iVar1 != 0x3b9ddf10)) &&
            (iVar1 != 0x3b9e3cd3)) && ((iVar1 != 0x3b9f2730 && (iVar1 != 0x3b9f9c62)))) &&
          ((iVar1 != 0x3b9fc371 && ((iVar1 != 0x3b9fcb40 && (iVar1 != 0x3b9fe698)))))) &&
         ((iVar1 != 0x3ba09e30 && ((iVar1 != 0x3ba0c928 && (iVar1 != 0x3ba224d0))))));
      pNext = *(void **)((long)pNext + 8)) {
  }
  return pNext;
}

Assistant:

static const void *pnext_chain_pdf2_skip_ignored_entries(const void *pNext)
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);
		bool ignored;

		switch (base->sType)
		{
		// Robustness tends to affect shader compilation.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		// Affects compilation on NV.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		// Affects compilation on RADV.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		// Workaround: Affects compilation on NV and is causing some awkward cache corruption on some drivers.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		// RADV: Might want to turn off FMASK at some point based on this.
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		// RADV uses these :(
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
			ignored = false;
			break;

		default:
			ignored = true;
			break;
		}

		if (ignored)
			pNext = base->pNext;
		else
			break;
	}

	return pNext;
}